

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall xLearn::Solver::Clear(Solver *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Model *this_00;
  ostream *poVar2;
  pointer ppRVar3;
  pointer ppRVar4;
  ulong uVar5;
  Modifier bold;
  Modifier reset;
  Modifier green;
  Modifier local_60;
  Modifier local_5c;
  string local_58;
  string local_38;
  
  paVar1 = &local_58.field_2;
  local_60.code = RESET;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
             ,"");
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Clear","");
  poVar2 = Logger::Start(INFO,&local_58,0x270,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Clear the xLearn environment ...",0x20)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  Logger::~Logger((Logger *)&local_60);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Clear the xLearn environment ...","");
  local_60.code = BOLD;
  local_5c.code = RESET;
  local_38._M_dataplus._M_p._0_4_ = 0x20;
  poVar2 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_38);
  poVar2 = Color::operator<<(poVar2,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[ ACTION     ] ",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_58._M_dataplus._M_p,local_58._M_string_length);
  poVar2 = Color::operator<<(poVar2,&local_5c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this_00 = this->model_;
  if (this_00 != (Model *)0x0) {
    Model::~Model(this_00);
  }
  operator_delete(this_00);
  ppRVar3 = (this->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppRVar4 = (this->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppRVar4 != ppRVar3) {
    uVar5 = 0;
    do {
      if (ppRVar3[uVar5] != (Reader *)0x0) {
        (*ppRVar3[uVar5]->_vptr_Reader[1])();
        ppRVar3 = (this->reader_).
                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppRVar4 = (this->reader_).
                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)ppRVar4 - (long)ppRVar3 >> 3));
  }
  if (ppRVar4 != ppRVar3) {
    (this->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar3;
  }
  return;
}

Assistant:

void Solver::Clear() {
  LOG(INFO) << "Clear the xLearn environment ...";
  Color::print_action("Clear the xLearn environment ...");
  // Clear model
  delete this->model_;
  // Clear Reader
  for (size_t i = 0; i < this->reader_.size(); ++i) {
    if (reader_[i] != nullptr) {
      delete reader_[i];
    }
  }
  reader_.clear();
}